

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O3

UnicodeString * __thiscall
icu_63::Normalizer2WithImpl::normalize
          (Normalizer2WithImpl *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  char16_t *pcVar6;
  ReorderingBuffer buffer;
  ReorderingBuffer local_68;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar6 = (src->fUnion).fFields.fArray;
      }
      else {
        pcVar6 = (char16_t *)((long)&src->fUnion + 2);
      }
      if ((dest != src) && (pcVar6 != (char16_t *)0x0)) {
        uVar1 = (dest->fUnion).fStackFields.fLengthAndFlags;
        uVar3 = 2;
        if ((uVar1 & 1) == 0) {
          uVar3 = uVar1 & 0x1e;
        }
        (dest->fUnion).fStackFields.fLengthAndFlags = uVar3;
        local_68.impl = this->impl;
        local_68.start = (UChar *)0x0;
        local_68.reorderStart._0_5_ = 0;
        local_68.reorderStart._5_3_ = 0;
        local_68.limit._0_5_ = 0;
        local_68._37_8_ = 0;
        sVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          uVar5 = (src->fUnion).fFields.fLength;
        }
        else {
          uVar5 = (int)sVar2 >> 5;
        }
        local_68.str = dest;
        iVar4 = ReorderingBuffer::init(&local_68,(EVP_PKEY_CTX *)(ulong)uVar5);
        if ((char)iVar4 != '\0') {
          sVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar4 = (src->fUnion).fFields.fLength;
          }
          else {
            iVar4 = (int)sVar2 >> 5;
          }
          (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x12])
                    (this,pcVar6,pcVar6 + iVar4,&local_68,errorCode);
        }
        ReorderingBuffer::~ReorderingBuffer(&local_68);
        return dest;
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  UnicodeString::setToBogus(dest);
  return dest;
}

Assistant:

virtual UnicodeString &
    normalize(const UnicodeString &src,
              UnicodeString &dest,
              UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            dest.setToBogus();
            return dest;
        }
        const UChar *sArray=src.getBuffer();
        if(&dest==&src || sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            dest.setToBogus();
            return dest;
        }
        dest.remove();
        ReorderingBuffer buffer(impl, dest);
        if(buffer.init(src.length(), errorCode)) {
            normalize(sArray, sArray+src.length(), buffer, errorCode);
        }
        return dest;
    }